

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_has_stmt(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,2,0,"yyPush");
  yyDo(G,yy_1_has_stmt,G->begin,G->end,"yy_1_has_stmt");
  iVar5 = yymatchString(G,"has");
  if ((iVar5 == 0) || (iVar5 = yy_ws(G), iVar5 == 0)) goto LAB_00106699;
  do {
    iVar5 = G->pos;
    iVar3 = G->thunkpos;
    iVar6 = yy_ws(G);
  } while (iVar6 != 0);
  G->pos = iVar5;
  G->thunkpos = iVar3;
  iVar5 = yy_attr_vars(G);
  if (iVar5 == 0) goto LAB_00106699;
  yyDo(G,yySet,-2,0,"yySet");
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  do {
    iVar6 = G->pos;
    iVar4 = G->thunkpos;
    iVar7 = yy_ws(G);
  } while (iVar7 != 0);
  G->pos = iVar6;
  G->thunkpos = iVar4;
  iVar6 = yymatchChar(G,0x3d);
  if (iVar6 == 0) {
LAB_00106640:
    G->pos = iVar5;
    G->thunkpos = iVar3;
  }
  else {
    do {
      iVar6 = G->pos;
      iVar4 = G->thunkpos;
      iVar7 = yy_ws(G);
    } while (iVar7 != 0);
    G->pos = iVar6;
    G->thunkpos = iVar4;
    iVar6 = yy_loose_or_expr(G);
    if (iVar6 == 0) goto LAB_00106640;
    yyDo(G,yySet,-1,0,"yySet");
  }
  iVar5 = yy_eat_terminator(G);
  if (iVar5 != 0) {
    yyDo(G,yy_2_has_stmt,G->begin,G->end,"yy_2_has_stmt");
    yyDo(G,yyPop,2,0,"yyPop");
    return 1;
  }
LAB_00106699:
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_has_stmt(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "has_stmt"));
  yyDo(G, yy_1_has_stmt, G->begin, G->end, "yy_1_has_stmt");
  if (!yymatchString(G, "has")) goto l906;
  if (!yy_ws(G))  goto l906;

  l907:;	
  {  int yypos908= G->pos, yythunkpos908= G->thunkpos;  if (!yy_ws(G))  goto l908;
  goto l907;
  l908:;	  G->pos= yypos908; G->thunkpos= yythunkpos908;
  }  if (!yy_attr_vars(G))  goto l906;
  yyDo(G, yySet, -2, 0, "yySet");

  {  int yypos909= G->pos, yythunkpos909= G->thunkpos;  if (!yy__(G))  goto l909;
  if (!yymatchChar(G, '=')) goto l909;
  if (!yy__(G))  goto l909;
  if (!yy_expr(G))  goto l909;
  yyDo(G, yySet, -1, 0, "yySet");
  goto l910;
  l909:;	  G->pos= yypos909; G->thunkpos= yythunkpos909;
  }
  l910:;	  if (!yy_eat_terminator(G))  goto l906;
  yyDo(G, yy_2_has_stmt, G->begin, G->end, "yy_2_has_stmt");
  yyprintf((stderr, "  ok   has_stmt"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l906:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "has_stmt"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}